

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

void __thiscall pbrt::MixTexture::readFrom(MixTexture *this,BinaryReader *binary)

{
  BinaryReader::read<pbrt::Texture>(binary,&this->map_amount);
  BinaryReader::read<pbrt::Texture>(binary,&this->tex1);
  BinaryReader::read<pbrt::Texture>(binary,&this->tex2);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->scale1);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->scale2);
  BinaryReader::read<pbrt::math::vec3f,void>(binary,&this->amount);
  return;
}

Assistant:

void MixTexture::readFrom(BinaryReader &binary) 
  {
    Texture::readFrom(binary);
    binary.read(map_amount);
    binary.read(tex1);
    binary.read(tex2);
    binary.read(scale1);
    binary.read(scale2);
    binary.read(amount);
  }